

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DLoadSaveMenu::Drawer(DLoadSaveMenu *this)

{
  FSaveGameNode *string;
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  FSaveGameNode **ppFVar8;
  undefined4 uVar9;
  bool bVar10;
  char *local_60;
  char local_4a [2];
  int local_48;
  int iStack_44;
  char curs [2];
  int color;
  int textlen_1;
  char *text_1;
  int textlen;
  char *text;
  uint local_20;
  int iStack_1c;
  bool didSeeSelected;
  uint j;
  int i;
  FSaveGameNode *node;
  DLoadSaveMenu *this_local;
  
  DListMenu::Drawer(&this->super_DListMenu);
  if (((gameaction != ga_loadgame) && (gameaction != ga_loadgamehidecon)) &&
     (gameaction != ga_savegame)) {
    V_DrawFrame(this->savepicLeft,this->savepicTop,this->savepicWidth,this->savepicHeight);
    if (this->SavePic == (FTexture *)0x0) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (screen,(ulong)(uint)this->savepicLeft,(ulong)(uint)this->savepicTop,
                 (ulong)(uint)(this->savepicLeft + this->savepicWidth),
                 (ulong)(uint)(this->savepicTop + this->savepicHeight),0,0);
      uVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
      if (uVar5 != 0) {
        if ((this->Selected == -1) ||
           (ppFVar8 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                                (&SaveGames,(long)this->Selected),
           ((*ppFVar8)->bOldVersion & 1U) == 0)) {
          local_60 = FStringTable::operator()(&GStrings,"MNU_NOPICTURE");
        }
        else {
          local_60 = FStringTable::operator()(&GStrings,"MNU_DIFFVERSION");
        }
        iVar3 = FFont::StringWidth(SmallFont,local_60);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,5,
                          this->savepicLeft + (this->savepicWidth - iVar3 * CleanXfac) / 2,
                          this->savepicTop + (this->savepicHeight - this->rowHeight) / 2,local_60,
                          0x40001393,1,0);
      }
    }
    else {
      DCanvas::DrawTexture
                ((DCanvas *)screen,this->SavePic,(double)this->savepicLeft,(double)this->savepicTop,
                 0x40001389,(ulong)(uint)this->savepicWidth,0x4000138a,
                 (ulong)(uint)this->savepicHeight,0x400013a5,0,0);
    }
    V_DrawFrame(this->commentLeft,this->commentTop,this->commentWidth,this->commentHeight);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)this->commentLeft,(ulong)(uint)this->commentTop,
               (ulong)(uint)this->commentRight,(ulong)(uint)this->commentBottom,0,0);
    if (this->SaveComment != (FBrokenLines *)0x0) {
      iStack_1c = 0;
      while( true ) {
        pDVar2 = screen;
        pFVar1 = SmallFont;
        bVar10 = false;
        if ((this->SaveComment != (FBrokenLines *)0x0) &&
           (bVar10 = false, -1 < this->SaveComment[iStack_1c].Width)) {
          bVar10 = iStack_1c < 6;
        }
        if (!bVar10) break;
        iVar3 = this->commentLeft;
        iVar6 = this->commentTop;
        iVar4 = FFont::GetHeight(SmallFont);
        iVar4 = iVar4 * iStack_1c * CleanYfac;
        pcVar7 = FString::operator_cast_to_char_(&this->SaveComment[iStack_1c].Text);
        DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,5,iVar3,iVar6 + iVar4,pcVar7,0x40001393,1,0);
        iStack_1c = iStack_1c + 1;
      }
    }
    V_DrawFrame(this->listboxLeft,this->listboxTop,this->listboxWidth,this->listboxHeight);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)this->listboxLeft,(ulong)(uint)this->listboxTop,
               (ulong)(uint)this->listboxRight,(ulong)(uint)this->listboxBottom,0,0);
    uVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (uVar5 == 0) {
      pcVar7 = FStringTable::operator()(&GStrings,"MNU_NOFILES");
      iStack_44 = FFont::StringWidth(SmallFont,pcVar7);
      iStack_44 = iStack_44 * CleanXfac;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,5,
                        this->listboxLeft + (this->listboxWidth - iStack_44) / 2,
                        this->listboxTop + (this->listboxHeight - this->rowHeight) / 2,pcVar7,
                        0x40001393,1,0);
    }
    else {
      iStack_1c = 0;
      local_20 = this->TopItem;
      while( true ) {
        bVar10 = false;
        if (iStack_1c < this->listboxRows) {
          uVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
          bVar10 = local_20 < uVar5;
        }
        if (!bVar10) break;
        ppFVar8 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,(ulong)local_20);
        string = *ppFVar8;
        if ((string->bOldVersion & 1U) == 0) {
          if ((string->bMissingWads & 1U) == 0) {
            if (local_20 == this->Selected) {
              local_48 = 9;
            }
            else {
              local_48 = 1;
            }
          }
          else {
            local_48 = 8;
          }
        }
        else {
          local_48 = 7;
        }
        if (local_20 == this->Selected) {
          uVar9 = 0xff0000ff;
          if ((this->mEntering & 1U) != 0) {
            uVar9 = 0xffff0000;
          }
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                    (screen,(ulong)(uint)this->listboxLeft,
                     (ulong)(uint)(this->listboxTop + this->rowHeight * iStack_1c),
                     (ulong)(uint)this->listboxRight,
                     (ulong)(uint)(this->listboxTop + this->rowHeight * (iStack_1c + 1)),0xffffffff,
                     uVar9);
          if ((this->mEntering & 1U) == 0) {
            DCanvas::DrawText((DCanvas *)screen,SmallFont,local_48,this->listboxLeft + 1,
                              this->listboxTop + this->rowHeight * iStack_1c + CleanYfac,
                              string->Title,0x40001393,1,0);
          }
          else {
            DCanvas::DrawText((DCanvas *)screen,SmallFont,9,this->listboxLeft + 1,
                              this->listboxTop + this->rowHeight * iStack_1c + CleanYfac,
                              this->savegamestring,0x40001393,1,0);
            local_4a[0] = FFont::GetCursor(SmallFont);
            pDVar2 = screen;
            pFVar1 = SmallFont;
            local_4a[1] = 0;
            iVar3 = this->listboxLeft;
            iVar6 = FFont::StringWidth(SmallFont,this->savegamestring);
            DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,9,iVar3 + 1 + iVar6 * CleanXfac,
                              this->listboxTop + this->rowHeight * iStack_1c + CleanYfac,local_4a,
                              0x40001393,1,0);
          }
        }
        else {
          DCanvas::DrawText((DCanvas *)screen,SmallFont,local_48,this->listboxLeft + 1,
                            this->listboxTop + this->rowHeight * iStack_1c + CleanYfac,string->Title
                            ,0x40001393,1,0);
        }
        iStack_1c = iStack_1c + 1;
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::Drawer ()
{
	Super::Drawer();

	FSaveGameNode *node;
	int i;
	unsigned j;
	bool didSeeSelected = false;

	// Draw picture area
	if (gameaction == ga_loadgame || gameaction == ga_loadgamehidecon || gameaction == ga_savegame)
	{
		return;
	}

	V_DrawFrame (savepicLeft, savepicTop, savepicWidth, savepicHeight);
	if (SavePic != NULL)
	{
		screen->DrawTexture(SavePic, savepicLeft, savepicTop,
			DTA_DestWidth, savepicWidth,
			DTA_DestHeight, savepicHeight,
			DTA_Masked, false,
			TAG_DONE);
	}
	else
	{
		screen->Clear (savepicLeft, savepicTop,
			savepicLeft+savepicWidth, savepicTop+savepicHeight, 0, 0);

		if (SaveGames.Size() > 0)
		{
			const char *text =
				(Selected == -1 || !SaveGames[Selected]->bOldVersion)
				? GStrings("MNU_NOPICTURE") : GStrings("MNU_DIFFVERSION");
			const int textlen = SmallFont->StringWidth (text)*CleanXfac;

			screen->DrawText (SmallFont, CR_GOLD, savepicLeft+(savepicWidth-textlen)/2,
				savepicTop+(savepicHeight-rowHeight)/2, text,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// Draw comment area
	V_DrawFrame (commentLeft, commentTop, commentWidth, commentHeight);
	screen->Clear (commentLeft, commentTop, commentRight, commentBottom, 0, 0);
	if (SaveComment != NULL)
	{
		// I'm not sure why SaveComment would go NULL in this loop, but I got
		// a crash report where it was NULL when i reached 1, so now I check
		// for that.
		for (i = 0; SaveComment != NULL && SaveComment[i].Width >= 0 && i < 6; ++i)
		{
			screen->DrawText (SmallFont, CR_GOLD, commentLeft, commentTop
				+ SmallFont->GetHeight()*i*CleanYfac, SaveComment[i].Text,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// Draw file area
	V_DrawFrame (listboxLeft, listboxTop, listboxWidth, listboxHeight);
	screen->Clear (listboxLeft, listboxTop, listboxRight, listboxBottom, 0, 0);

	if (SaveGames.Size() == 0)
	{
		const char * text = GStrings("MNU_NOFILES");
		const int textlen = SmallFont->StringWidth (text)*CleanXfac;

		screen->DrawText (SmallFont, CR_GOLD, listboxLeft+(listboxWidth-textlen)/2,
			listboxTop+(listboxHeight-rowHeight)/2, text,
			DTA_CleanNoMove, true, TAG_DONE);
		return;
	}

	for (i = 0, j = TopItem; i < listboxRows && j < SaveGames.Size(); i++,j++)
	{
		int color;
		node = SaveGames[j];
		if (node->bOldVersion)
		{
			color = CR_BLUE;
		}
		else if (node->bMissingWads)
		{
			color = CR_ORANGE;
		}
		else if ((int)j == Selected)
		{
			color = CR_WHITE;
		}
		else
		{
			color = CR_TAN;
		}

		if ((int)j == Selected)
		{
			screen->Clear (listboxLeft, listboxTop+rowHeight*i,
				listboxRight, listboxTop+rowHeight*(i+1), -1,
				mEntering ? MAKEARGB(255,255,0,0) : MAKEARGB(255,0,0,255));
			didSeeSelected = true;
			if (!mEntering)
			{
				screen->DrawText (SmallFont, color,
					listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, node->Title,
					DTA_CleanNoMove, true, TAG_DONE);
			}
			else
			{
				screen->DrawText (SmallFont, CR_WHITE,
					listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, savegamestring,
					DTA_CleanNoMove, true, TAG_DONE);

				char curs[2] = { SmallFont->GetCursor(), 0 };
				screen->DrawText (SmallFont, CR_WHITE,
					listboxLeft+1+SmallFont->StringWidth (savegamestring)*CleanXfac,
					listboxTop+rowHeight*i+CleanYfac, 
					curs,
					DTA_CleanNoMove, true, TAG_DONE);
			}
		}
		else
		{
			screen->DrawText (SmallFont, color,
				listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, node->Title,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}
}